

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O2

void __thiscall
helics::apps::RampGenerator::set(RampGenerator *this,string_view parameter,double val)

{
  long lVar1;
  bool bVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  
  __y._M_str = "level";
  __y._M_len = 5;
  bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y);
  if (bVar2) {
    this->level = val;
  }
  else {
    __y_00._M_str = "ramp";
    __y_00._M_len = 4;
    bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_00);
    if (!bVar2) {
      SignalGenerator::set(&this->super_SignalGenerator,(string_view)parameter,val);
      return;
    }
    this->ramp = val;
  }
  lVar1 = (this->super_SignalGenerator).lastTime.internalTimeCode;
  if ((this->super_SignalGenerator).keyTime.internalTimeCode < lVar1) {
    (this->super_SignalGenerator).keyTime.internalTimeCode = lVar1;
  }
  return;
}

Assistant:

void RampGenerator::set(std::string_view parameter, double val)
    {
        if (parameter == "level") {
            level = val;
            if (lastTime > keyTime) {
                keyTime = lastTime;
            }
        } else if (parameter == "ramp") {
            ramp = val;
            if (lastTime > keyTime) {
                keyTime = lastTime;
            }
        } else {
            SignalGenerator::set(parameter, val);
        }
    }